

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_cf_string_gsub(lua_State *L)

{
  char cVar1;
  lua_State *L_00;
  byte bVar2;
  int iVar3;
  byte *s;
  char *pcVar4;
  byte *e;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_t l;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  ulong local_2298;
  lua_State *local_2290;
  char *local_2288;
  ulong local_2280;
  lua_Integer local_2278;
  int local_2270;
  undefined4 uStack_226c;
  MatchState local_2268;
  luaL_Buffer local_2048;
  
  s = (byte *)luaL_checklstring(L,1,(size_t *)&local_2270);
  pcVar4 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar3 = lua_type(L,3);
  local_2278 = luaL_optinteger(L,4,(long)(local_2270 + 1));
  cVar1 = *pcVar4;
  if (3 < iVar3 - 3U) {
    lj_err_arg(L,3,LJ_ERR_NOSFT);
  }
  pcVar4 = pcVar4 + (cVar1 == '^');
  luaL_buffinit(L,&local_2048);
  local_2268.src_end = (char *)(s + CONCAT44(uStack_226c,local_2270));
  uVar6 = 0;
  local_2290 = L;
  local_2288 = pcVar4;
  local_2268.src_init = (char *)s;
  local_2268.L = L;
  do {
    e = s;
    if ((int)local_2278 <= (int)uVar6) break;
    local_2268.level = 0;
    local_2268.depth = 0;
    e = (byte *)match(&local_2268,(char *)s,pcVar4);
    L_00 = local_2268.L;
    if (e == (byte *)0x0) {
LAB_0012012f:
      e = s;
      if (local_2268.src_end <= s) break;
      if (&stack0xffffffffffffffd0 <= local_2048.p) {
        luaL_prepbuffer(&local_2048);
      }
      e = s + 1;
      *local_2048.p = *s;
      local_2048.p = (char *)((byte *)local_2048.p + 1);
    }
    else {
      iVar3 = lua_type(local_2268.L,3);
      if (iVar3 - 3U < 2) {
        local_2280 = uVar6;
        pcVar5 = lua_tolstring(L_00,3,&local_2298);
        pcVar4 = local_2288;
        uVar6 = local_2280;
        if (local_2298 != 0) {
          uVar7 = 0;
          do {
            bVar2 = pcVar5[uVar7];
            if (bVar2 == 0x25) {
              bVar2 = pcVar5[uVar7 + 1];
              uVar7 = uVar7 + 1;
              if ((""[(ulong)bVar2 + 1] & 8) == 0) {
                if (&stack0xffffffffffffffd0 <= local_2048.p) {
                  luaL_prepbuffer(&local_2048);
                  bVar2 = pcVar5[uVar7];
                }
                *local_2048.p = bVar2;
                local_2048.p = (char *)((byte *)local_2048.p + 1);
              }
              else if (bVar2 == 0x30) {
                luaL_addlstring(&local_2048,(char *)s,(long)e - (long)s);
              }
              else {
                push_onecapture(&local_2268,(char)bVar2 + -0x31,(char *)s,(char *)e);
                luaL_addvalue(&local_2048);
              }
            }
            else {
              if (&stack0xffffffffffffffd0 <= local_2048.p) {
                luaL_prepbuffer(&local_2048);
                bVar2 = pcVar5[uVar7];
              }
              *local_2048.p = bVar2;
              local_2048.p = (char *)((byte *)local_2048.p + 1);
            }
            uVar7 = uVar7 + 1;
            pcVar4 = local_2288;
            uVar6 = local_2280;
          } while (uVar7 < local_2298);
        }
      }
      else {
        if (iVar3 == 5) {
          push_onecapture(&local_2268,0,(char *)s,(char *)e);
          lua_gettable(L_00,3);
        }
        else if (iVar3 == 6) {
          lua_pushvalue(L_00,3);
          iVar3 = push_captures(&local_2268,(char *)s,(char *)e);
          lua_call(L_00,iVar3,1);
        }
        iVar3 = lua_toboolean(L_00,-1);
        if (iVar3 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,(char *)s,(long)e - (long)s);
        }
        else {
          iVar3 = lua_isstring(L_00,-1);
          if (iVar3 == 0) {
            iVar3 = lua_type(L_00,-1);
            pcVar4 = lua_typename(L_00,iVar3);
            lj_err_callerv(L_00,LJ_ERR_STRGSRV,pcVar4);
          }
        }
        luaL_addvalue(&local_2048);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      if (e <= s) goto LAB_0012012f;
    }
    s = e;
  } while (cVar1 != '^');
  luaL_addlstring(&local_2048,(char *)e,(long)local_2268.src_end - (long)e);
  luaL_pushresult(&local_2048);
  lua_pushinteger(local_2290,(long)(int)uVar6);
  return 2;
}

Assistant:

LJLIB_CF(string_gsub)
{
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, (int)(srcl+1));
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  if (!(tr == LUA_TNUMBER || tr == LUA_TSTRING ||
	tr == LUA_TFUNCTION || tr == LUA_TTABLE))
    lj_err_arg(L, 3, LJ_ERR_NOSFT);
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = ms.depth = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else
      break;
    if (anchor)
      break;
  }
  luaL_addlstring(&b, src, (size_t)(ms.src_end-src));
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}